

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

btVector3 __thiscall btMultiBody::worldPosToLocal(btMultiBody *this,int i,btVector3 *world_pos)

{
  float fVar1;
  undefined8 uVar2;
  btMultibodyLink *pbVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  btVector3 bVar15;
  
  if (i == -1) {
    fVar4 = world_pos->m_floats[0] - (this->m_basePos).m_floats[0];
    fVar10 = (this->m_baseQuat).super_btQuadWord.m_floats[3];
    fVar1 = (this->m_baseQuat).super_btQuadWord.m_floats[0];
    uVar2 = *(undefined8 *)((this->m_basePos).m_floats + 1);
    fVar14 = (float)*(undefined8 *)(world_pos->m_floats + 1) - (float)uVar2;
    fVar13 = (float)((ulong)*(undefined8 *)(world_pos->m_floats + 1) >> 0x20) -
             (float)((ulong)uVar2 >> 0x20);
    uVar2 = *(undefined8 *)((this->m_baseQuat).super_btQuadWord.m_floats + 1);
    fVar5 = (float)uVar2;
    fVar7 = (float)((ulong)uVar2 >> 0x20);
    fVar9 = -fVar7;
    fVar11 = -fVar1;
    fVar8 = (fVar4 * fVar10 + fVar13 * fVar5) - fVar7 * fVar14;
    fVar6 = (fVar14 * fVar10 + fVar4 * fVar7) - fVar1 * fVar13;
    fVar12 = (fVar10 * fVar13 + fVar14 * fVar1) - fVar5 * fVar4;
    fVar14 = fVar13 * fVar9 + (fVar4 * fVar11 - fVar14 * fVar5);
    fVar4 = fVar5 * fVar12 + fVar6 * fVar9 + fVar11 * fVar14 + fVar10 * fVar8;
    fVar7 = fVar8 * fVar7 + fVar11 * fVar12 + -fVar5 * fVar14 + fVar6 * fVar10;
    fVar10 = fVar6 * fVar1 + -fVar5 * fVar8 + fVar9 * fVar14 + fVar12 * fVar10;
  }
  else {
    pbVar3 = (this->m_links).m_data;
    bVar15 = worldPosToLocal(this,pbVar3[i].m_parent,world_pos);
    fVar5 = bVar15.m_floats[0];
    fVar4 = bVar15.m_floats[1];
    fVar10 = pbVar3[i].m_cachedRotParentToThis.super_btQuadWord.m_floats[3];
    fVar1 = pbVar3[i].m_cachedRotParentToThis.super_btQuadWord.m_floats[0];
    fVar8 = bVar15.m_floats[2];
    uVar2 = *(undefined8 *)(pbVar3[i].m_cachedRotParentToThis.super_btQuadWord.m_floats + 1);
    fVar14 = (float)uVar2;
    fVar7 = (float)((ulong)uVar2 >> 0x20);
    fVar12 = -fVar7;
    fVar13 = -fVar1;
    fVar6 = (fVar10 * fVar5 + fVar8 * fVar14) - fVar4 * fVar7;
    fVar9 = (fVar10 * fVar4 + fVar5 * fVar7) - fVar8 * fVar1;
    fVar11 = (fVar10 * fVar8 + fVar4 * fVar1) - fVar14 * fVar5;
    fVar5 = (fVar5 * fVar13 - fVar4 * fVar14) + fVar12 * fVar8;
    fVar4 = (fVar14 * fVar11 + fVar9 * fVar12 + fVar13 * fVar5 + fVar10 * fVar6) -
            pbVar3[i].m_cachedRVector.m_floats[0];
    uVar2 = *(undefined8 *)(pbVar3[i].m_cachedRVector.m_floats + 1);
    fVar7 = (fVar6 * fVar7 + fVar13 * fVar11 + -fVar14 * fVar5 + fVar9 * fVar10) - (float)uVar2;
    fVar10 = (fVar9 * fVar1 + -fVar14 * fVar6 + fVar12 * fVar5 + fVar11 * fVar10) -
             (float)((ulong)uVar2 >> 0x20);
  }
  bVar15.m_floats[1] = fVar7;
  bVar15.m_floats[0] = fVar4;
  bVar15.m_floats[2] = fVar10;
  bVar15.m_floats[3] = 0.0;
  return (btVector3)bVar15.m_floats;
}

Assistant:

btVector3 btMultiBody::worldPosToLocal(int i, const btVector3 &world_pos) const
{
    if (i == -1) {
        // world to base
        return quatRotate(getWorldToBaseRot(),(world_pos - getBasePos()));
    } else {
        // find position in parent frame, then transform to current frame
        return quatRotate(getParentToLocalRot(i),worldPosToLocal(getParent(i), world_pos)) - getRVector(i);
    }
}